

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O3

int coda_cdf_reopen(coda_product **product)

{
  coda_product *product_00;
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  int iVar14;
  coda_cdf_product *product_file;
  char *pcVar15;
  coda_type_record *definition;
  coda_mem_record *pcVar16;
  undefined1 auVar17 [16];
  undefined8 local_30;
  
  product_file = (coda_cdf_product *)malloc(0x90);
  if (product_file == (coda_cdf_product *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x90,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                   ,0x5d8);
    coda_close(*product);
    return -1;
  }
  product_00 = *product;
  product_file->file_size = product_00->file_size;
  product_file->format = coda_format_cdf;
  product_file->root_type = (coda_mem_record *)0x0;
  product_file->product_definition = (coda_product_definition *)0x0;
  product_file->product_variable_size = (long *)0x0;
  product_file->product_variable = (int64_t **)0x0;
  product_file->mem_size = 0;
  product_file->mem_ptr = (uint8_t *)0x0;
  product_file->raw_product = product_00;
  pcVar15 = strdup(product_00->filename);
  product_file->filename = pcVar15;
  if (pcVar15 == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not duplicate filename string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                   ,0x5ec);
    coda_cdf_close((coda_product *)product_file);
    return -1;
  }
  iVar14 = read_bytes(product_00,0,8,&local_30);
  if (-1 < iVar14) {
    auVar5._8_6_ = 0;
    auVar5._0_8_ = local_30;
    auVar5[0xe] = (char)(local_30 >> 0x38);
    auVar6._8_4_ = 0;
    auVar6._0_8_ = local_30;
    auVar6[0xc] = (char)(local_30 >> 0x30);
    auVar6._13_2_ = auVar5._13_2_;
    auVar7._8_4_ = 0;
    auVar7._0_8_ = local_30;
    auVar7._12_3_ = auVar6._12_3_;
    auVar8._8_2_ = 0;
    auVar8._0_8_ = local_30;
    auVar8[10] = (char)(local_30 >> 0x28);
    auVar8._11_4_ = auVar7._11_4_;
    auVar9._8_2_ = 0;
    auVar9._0_8_ = local_30;
    auVar9._10_5_ = auVar8._10_5_;
    auVar10[8] = (char)(local_30 >> 0x20);
    auVar10._0_8_ = local_30;
    auVar10._9_6_ = auVar9._9_6_;
    auVar11._7_8_ = 0;
    auVar11._0_7_ = auVar10._8_7_;
    auVar12._1_8_ = SUB158(auVar11 << 0x40,7);
    auVar12[0] = (char)(local_30 >> 0x18);
    auVar12._9_6_ = 0;
    auVar13._1_10_ = SUB1510(auVar12 << 0x30,5);
    auVar13[0] = (char)(local_30 >> 0x10);
    auVar13._11_4_ = 0;
    auVar17._3_12_ = SUB1512(auVar13 << 0x20,3);
    auVar17[2] = (char)(local_30 >> 8);
    auVar17[0] = (byte)local_30;
    auVar17[1] = 0;
    auVar17[0xf] = 0;
    auVar17 = pshuflw(auVar17,auVar17,0x1b);
    auVar17 = pshufhw(auVar17,auVar17,0x1b);
    sVar1 = auVar17._0_2_;
    sVar2 = auVar17._2_2_;
    sVar3 = auVar17._4_2_;
    sVar4 = auVar17._6_2_;
    iVar14 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar17[6] - (0xff < sVar4),
                      CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar17[4] - (0xff < sVar3),
                               CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar17[2] - (0xff < sVar2),
                                        (0 < sVar1) * (sVar1 < 0x100) * auVar17[0] - (0xff < sVar1))
                              ));
    sVar1 = auVar17._8_2_;
    sVar2 = auVar17._10_2_;
    sVar3 = auVar17._12_2_;
    sVar4 = auVar17._14_2_;
    local_30 = CONCAT17((0 < sVar4) * (sVar4 < 0x100) * auVar17[0xe] - (0xff < sVar4),
                        CONCAT16((0 < sVar3) * (sVar3 < 0x100) * auVar17[0xc] - (0xff < sVar3),
                                 CONCAT15((0 < sVar2) * (sVar2 < 0x100) * auVar17[10] -
                                          (0xff < sVar2),
                                          CONCAT14((0 < sVar1) * (sVar1 < 0x100) * auVar17[8] -
                                                   (0xff < sVar1),iVar14))));
    if ((iVar14 == 0xffff) || (iVar14 == -0x320d9ffe)) {
      pcVar15 = "CDF format version older than 3.0 is not supported";
    }
    else {
      local_30._4_4_ = (int)(local_30 >> 0x20);
      if (local_30._4_4_ != -0x3333ffff) {
        if ((iVar14 != -0x320cffff) || (local_30._4_4_ != 0xffff)) {
          __assert_fail("magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                        ,0x607,"int coda_cdf_reopen(coda_product **)");
        }
        definition = coda_type_record_new(coda_format_cdf);
        if (definition != (coda_type_record *)0x0) {
          pcVar16 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
          product_file->root_type = pcVar16;
          if (pcVar16 == (coda_mem_record *)0x0) {
            coda_cdf_close((coda_product *)product_file);
            coda_type_release((coda_type *)definition);
            return -1;
          }
          coda_type_release((coda_type *)definition);
          iVar14 = read_file(product_file);
          if (iVar14 == 0) {
            *product = (coda_product *)product_file;
            return 0;
          }
        }
        goto LAB_00121a3a;
      }
      pcVar15 = "full file compression not supported for CDF files";
    }
    coda_set_error(-200,pcVar15);
  }
LAB_00121a3a:
  coda_cdf_close((coda_product *)product_file);
  return -1;
}

Assistant:

int coda_cdf_reopen(coda_product **product)
{
    coda_cdf_product *product_file;
    coda_type_record *root_definition;
    uint32_t magic[2];

    product_file = (coda_cdf_product *)malloc(sizeof(coda_cdf_product));
    if (product_file == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       sizeof(coda_cdf_product), __FILE__, __LINE__);
        coda_close(*product);
        return -1;
    }
    product_file->filename = NULL;
    product_file->file_size = (*product)->file_size;
    product_file->format = coda_format_cdf;
    product_file->root_type = NULL;
    product_file->product_definition = NULL;
    product_file->product_variable_size = NULL;
    product_file->product_variable = NULL;
    product_file->mem_size = 0;
    product_file->mem_ptr = NULL;

    product_file->raw_product = *product;

    product_file->filename = strdup((*product)->filename);
    if (product_file->filename == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate filename string) (%s:%u)",
                       __FILE__, __LINE__);
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    /* magic */
    if (read_bytes(product_file->raw_product, 0, 8, magic) < 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_uint32(&magic[0]);
    swap_uint32(&magic[1]);
#endif
    if (magic[0] == 0x0000FFFF || magic[0] == 0xCDF26002)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF format version older than 3.0 is not supported");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    if (magic[1] == 0xCCCC0001)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "full file compression not supported for CDF files");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    assert(magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF);

    /* create root type */
    root_definition = coda_type_record_new(coda_format_cdf);
    if (root_definition == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    product_file->root_type = coda_mem_record_new(root_definition, NULL);
    if (product_file->root_type == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        coda_type_release((coda_type *)root_definition);
        return -1;
    }
    coda_type_release((coda_type *)root_definition);

    if (read_file(product_file) != 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    *product = (coda_product *)product_file;

    return 0;
}